

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  long lVar1;
  grasshopper_w128_t *subkeys;
  ulong uVar2;
  grasshopper_w128_t *in_RCX;
  byte *in_RDX;
  grasshopper_w128_t *in_RSI;
  undefined8 in_RDI;
  bool bVar3;
  grasshopper_w128_t tmp;
  size_t lasted;
  size_t i;
  size_t blocks;
  uint num;
  uchar *iv;
  gost_grasshopper_cipher_ctx_ctr *c;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 *local_48;
  uint local_34;
  byte *local_18;
  grasshopper_w128_t *local_10;
  
  lVar1 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  EVP_CIPHER_CTX_iv_noconst(in_RDI);
  local_34 = EVP_CIPHER_CTX_get_num(in_RDI);
  subkeys = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (; bVar3 = (local_34 & 0xf) != 0, uVar4 = bVar3 && subkeys != (grasshopper_w128_t *)0x0,
      bVar3 && subkeys != (grasshopper_w128_t *)0x0; local_34 = local_34 + 1) {
    local_10->b[0] = *local_18 ^ *(byte *)(lVar1 + 0x198 + (ulong)(local_34 & 0xf));
    subkeys = (grasshopper_w128_t *)((long)subkeys - 1);
    local_18 = local_18 + 1;
    local_10 = (grasshopper_w128_t *)(local_10->b + 1);
  }
  uVar2 = (ulong)subkeys >> 4;
  for (local_48 = (undefined1 *)0x0; local_48 < uVar2; local_48 = (undefined1 *)((long)local_48 + 1)
      ) {
    apply_acpkm_grasshopper
              ((gost_grasshopper_cipher_ctx_ctr *)in_stack_ffffffffffffffa0,
               (uint *)CONCAT17(uVar4,in_stack_ffffffffffffff98));
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)subkeys,(grasshopper_w128_t *)in_stack_ffffffffffffffa8,
               (grasshopper_w128_t *)in_stack_ffffffffffffffa0,
               (grasshopper_w128_t *)CONCAT17(uVar4,in_stack_ffffffffffffff98));
    grasshopper_plus128((grasshopper_w128_t *)in_stack_ffffffffffffffa0,
                        (grasshopper_w128_t *)CONCAT17(uVar4,in_stack_ffffffffffffff98),
                        (grasshopper_w128_t *)0x127a82);
    grasshopper_copy128(local_10,(grasshopper_w128_t *)&stack0xffffffffffffffa0);
    ctr128_inc((uchar *)0x127a9b);
    local_18 = local_18 + 0x10;
    local_10 = local_10 + 1;
    local_34 = local_34 + 0x10;
    subkeys = ((grasshopper_round_keys_t *)((long)subkeys + -0xa0))->k + 9;
  }
  if (subkeys != (grasshopper_w128_t *)0x0) {
    apply_acpkm_grasshopper
              ((gost_grasshopper_cipher_ctx_ctr *)in_stack_ffffffffffffffa0,
               (uint *)CONCAT17(uVar4,in_stack_ffffffffffffff98));
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)subkeys,(grasshopper_w128_t *)in_stack_ffffffffffffffa8,
               (grasshopper_w128_t *)in_stack_ffffffffffffffa0,
               (grasshopper_w128_t *)CONCAT17(uVar4,in_stack_ffffffffffffff98));
    for (local_48 = (undefined1 *)0x0; local_48 < subkeys; local_48 = local_48 + 1) {
      local_10->b[(long)local_48] = local_48[lVar1 + 0x198] ^ local_18[(long)local_48];
    }
    ctr128_inc((uchar *)0x127b89);
    local_34 = local_34 + (int)subkeys;
  }
  EVP_CIPHER_CTX_set_num(in_RDI,local_34);
  return (int)in_RCX;
}

Assistant:

static int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,
                                               unsigned char *out,
                                               const unsigned char *in,
                                               size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    unsigned int num = EVP_CIPHER_CTX_num(ctx);
    size_t blocks, i, lasted = inl;
    grasshopper_w128_t tmp;

    while ((num & GRASSHOPPER_BLOCK_MASK) && lasted) {
        *out++ = *in++ ^ c->partial_buffer.b[num & GRASSHOPPER_BLOCK_MASK];
        --lasted;
        num++;
    }
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    // full parts
    for (i = 0; i < blocks; i++) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) & c->partial_buffer,
                                  &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer,
                            (grasshopper_w128_t *) in);
        grasshopper_copy128((grasshopper_w128_t *) out, &tmp);
        ctr128_inc(iv);
        in += GRASSHOPPER_BLOCK_SIZE;
        out += GRASSHOPPER_BLOCK_SIZE;
        num += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    // last part
    if (lasted > 0) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++)
            out[i] = c->partial_buffer.b[i] ^ in[i];
        ctr128_inc(iv);
        num += lasted;
    }
    EVP_CIPHER_CTX_set_num(ctx, num);

    return inl;
}